

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkUpdateNameIds(Abc_Ntk_t *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *__stream;
  Vec_Int_t *pVVar8;
  Abc_Obj_t *pAVar9;
  int iVar10;
  uint i;
  char pFileName [1000];
  
  if (p->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fb,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  pcVar6 = p->pSpec;
  sVar5 = strlen(pcVar6);
  if (999 < sVar5) {
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fc,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fd,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  pcVar6 = Extra_FileNameGenericAppend(pcVar6,"");
  pcVar7 = Extra_FileNameExtension(p->pSpec);
  sprintf(pFileName,"%s_%s_names.txt",pcVar6,pcVar7);
  __stream = fopen(pFileName,"r+");
  pVVar8 = Vec_IntAlloc(1000);
  Vec_IntPush(pVVar8,-1);
  iVar10 = 1;
  bVar1 = false;
  while (iVar2 = fgetc(__stream), iVar2 != -1) {
    if ((iVar2 != 0x20) || (bVar1)) {
      if (iVar2 == 10) {
        bVar1 = false;
      }
    }
    else {
      Vec_IntPush(pVVar8,iVar10);
      bVar1 = true;
    }
    iVar10 = iVar10 + 1;
  }
  i = 0;
  do {
    if (p->vObjs->nSize <= (int)i) {
      printf("Saved %d names into file \"%s\".\n",(ulong)(pVVar8->nSize - 1),pFileName);
      fclose(__stream);
      free(pVVar8->pArray);
      free(pVVar8);
      pVVar8 = p->vNameIds;
      if (pVVar8 != (Vec_Int_t *)0x0) {
        if (pVVar8->pArray != (int *)0x0) {
          free(pVVar8->pArray);
          p->vNameIds->pArray = (int *)0x0;
          pVVar8 = p->vNameIds;
          if (pVVar8 == (Vec_Int_t *)0x0) {
            return;
          }
        }
        free(pVVar8);
        p->vNameIds = (Vec_Int_t *)0x0;
      }
      return;
    }
    pAVar9 = Abc_NtkObj(p,i);
    if ((((i != 0) && (pAVar9 != (Abc_Obj_t *)0x0)) && ((int)i < p->vNameIds->nSize)) &&
       (iVar10 = Vec_IntEntry(p->vNameIds,i), iVar10 != 0)) {
      uVar3 = Vec_IntEntry(p->vNameIds,i);
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar4 = Vec_IntEntry(p->vNameIds,i);
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      if (pVVar8->nSize <= (int)(uVar3 >> 1)) {
        __assert_fail("iVar < Vec_IntSize(vStarts)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                      ,0x310,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
      }
      iVar10 = Vec_IntEntry(pVVar8,uVar3 >> 1);
      fseek(__stream,(long)iVar10,0);
      pcVar6 = "-";
      if ((uVar4 & 1) == 0) {
        pcVar6 = "";
      }
      fprintf(__stream,"%s%d",pcVar6,(ulong)i);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkUpdateNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    Vec_Int_t * vStarts;
    Abc_Obj_t * pObj;
    FILE * pFile;
    int i, c, iVar, fCompl, fSeenSpace, Counter = 0;
    assert( !Abc_NtkIsNetlist(p) );
    assert( strlen(p->pSpec) < 1000 );
    assert( p->vNameIds != NULL );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "r+" );
    // collect info about lines
    fSeenSpace = 0;
    vStarts = Vec_IntAlloc( 1000 );
    Vec_IntPush( vStarts, -1 );
    while ( (c = fgetc(pFile)) != EOF && ++Counter )
        if ( c == ' ' && !fSeenSpace )
            Vec_IntPush(vStarts, Counter), fSeenSpace = 1;
        else if ( c == '\n' )
            fSeenSpace = 0;
    // add info about names
    Abc_NtkForEachObj( p, pObj, i )
    {
        if ( i == 0 || i >= Vec_IntSize(p->vNameIds) || !Vec_IntEntry(p->vNameIds, i) )
            continue;
        iVar = Abc_Lit2Var( Vec_IntEntry(p->vNameIds, i) );
        fCompl = Abc_LitIsCompl( Vec_IntEntry(p->vNameIds, i) );
        assert( iVar < Vec_IntSize(vStarts) );
        fseek( pFile, Vec_IntEntry(vStarts, iVar), SEEK_SET );
        fprintf( pFile, "%s%d", fCompl? "-":"", i );
    }
    printf( "Saved %d names into file \"%s\".\n", Vec_IntSize(vStarts)-1, pFileName );
    fclose( pFile );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vNameIds );
//    Abc_NtkForEachObj( p, pObj, i )
//        Abc_ObjPrint( stdout, pObj );
}